

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

LengthData __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Value *v)

{
  qreal qVar1;
  storage_type_conflict *psVar2;
  undefined1 *puVar3;
  char cVar4;
  long lVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  LengthData LVar12;
  undefined1 *local_58;
  storage_type_conflict *local_50;
  QArrayData *local_48;
  storage_type_conflict *psStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_40 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString();
  puVar3 = local_38;
  psVar2 = psStack_40;
  local_58 = local_38;
  local_50 = psStack_40;
  QVar6.m_data = psStack_40;
  QVar6.m_size = (qsizetype)local_38;
  QVar9.m_data = L"px";
  QVar9.m_size = 2;
  cVar4 = QtPrivate::endsWith(QVar6,QVar9,CaseInsensitive);
  lVar5 = 1;
  if (cVar4 == '\0') {
    QVar7.m_data = psVar2;
    QVar7.m_size = (qsizetype)puVar3;
    QVar10.m_data = L"ex";
    QVar10.m_size = 2;
    cVar4 = QtPrivate::endsWith(QVar7,QVar10,CaseInsensitive);
    lVar5 = 2;
    if (cVar4 == '\0') {
      QVar8.m_data = psVar2;
      QVar8.m_size = (qsizetype)puVar3;
      QVar11.m_data = L"em";
      QVar11.m_size = 2;
      cVar4 = QtPrivate::endsWith(QVar8,QVar11,CaseInsensitive);
      lVar5 = 3;
      if (cVar4 == '\0') {
        lVar5 = (ulong)(v->type == Percentage) << 2;
        goto LAB_005d82db;
      }
    }
  }
  local_58 = puVar3 + -2;
LAB_005d82db:
  qVar1 = (qreal)QStringView::toDouble((bool *)&local_58);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    LVar12._8_8_ = lVar5;
    LVar12.number = qVar1;
    return LVar12;
  }
  __stack_chk_fail();
}

Assistant:

LengthData ValueExtractor::lengthValue(const Value& v)
{
    const QString str = v.variant.toString();
    QStringView s(str);
    LengthData data;
    data.unit = LengthData::None;
    if (s.endsWith(u"px", Qt::CaseInsensitive))
        data.unit = LengthData::Px;
    else if (s.endsWith(u"ex", Qt::CaseInsensitive))
        data.unit = LengthData::Ex;
    else if (s.endsWith(u"em", Qt::CaseInsensitive))
        data.unit = LengthData::Em;

    if (data.unit != LengthData::None)
        s.chop(2);
    else if (v.type == Value::Percentage)
        data.unit = LengthData::Percent;

    data.number = s.toDouble();
    return data;
}